

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O1

bool __thiscall
DIS::IFFFundamentalParameterData::operator==
          (IFFFundamentalParameterData *this,IFFFundamentalParameterData *rhs)

{
  bool bVar1;
  uchar idx;
  long lVar2;
  
  bVar1 = ((this->_pgrf == rhs->_pgrf && this->_frequency == rhs->_frequency) &&
          ((this->_applicableModes == rhs->_applicableModes &&
           this->_burstLength == rhs->_burstLength) && this->_pulseWidth == rhs->_pulseWidth)) &&
          this->_erp == rhs->_erp;
  lVar2 = 0;
  do {
    if (this->_systemSpecificData[lVar2] != rhs->_systemSpecificData[lVar2]) {
      bVar1 = false;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return bVar1;
}

Assistant:

bool IFFFundamentalParameterData::operator ==(const IFFFundamentalParameterData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_erp == rhs._erp) ) ivarsEqual = false;
     if( ! (_frequency == rhs._frequency) ) ivarsEqual = false;
     if( ! (_pgrf == rhs._pgrf) ) ivarsEqual = false;
     if( ! (_pulseWidth == rhs._pulseWidth) ) ivarsEqual = false;
     if( ! (_burstLength == rhs._burstLength) ) ivarsEqual = false;
     if( ! (_applicableModes == rhs._applicableModes) ) ivarsEqual = false;

     for(unsigned char idx = 0; idx < 3; idx++)
     {
          if(!(_systemSpecificData[idx] == rhs._systemSpecificData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }